

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::type_caster<float,_void>::load
          (type_caster<float,_void> *this,handle src,bool convert)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  handle src_00;
  object tmp;
  object local_28;
  double local_20;
  
  if ((src.m_ptr != (PyObject *)0x0) &&
     (((convert || ((src.m_ptr)->ob_type == (PyTypeObject *)&PyFloat_Type)) ||
      (iVar2 = PyType_IsSubtype((src.m_ptr)->ob_type,&PyFloat_Type), iVar2 != 0)))) {
    local_20 = (double)PyFloat_AsDouble(src.m_ptr);
    if (((local_20 != -1.0) || (NAN(local_20))) || (lVar3 = PyErr_Occurred(), lVar3 == 0)) {
      this->value = (float)local_20;
      return true;
    }
    PyErr_Clear();
    if ((convert) && (iVar2 = PyNumber_Check(src.m_ptr), iVar2 != 0)) {
      src_00.m_ptr = (PyObject *)PyNumber_Float(src.m_ptr);
      local_28.super_handle.m_ptr = (handle)(handle)src_00.m_ptr;
      PyErr_Clear();
      bVar1 = load(this,src_00,false);
      object::~object(&local_28);
      return bVar1;
    }
  }
  return false;
}

Assistant:

static typename std::enable_if<!std::is_floating_point<U>::value && std::is_unsigned<U>::value && (sizeof(U) <= sizeof(unsigned long)), handle>::type
    cast(U src, return_value_policy /* policy */, handle /* parent */) {
        return PYBIND11_LONG_FROM_UNSIGNED((unsigned long) src);
    }